

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O1

void __thiscall
HighsSplitDeque::WorkerBunk::publishWork(WorkerBunk *this,HighsSplitDeque *localDeque)

{
  atomic<unsigned_long> *paVar1;
  uint uVar2;
  uint32_t uVar3;
  HighsSplitDeque *pHVar4;
  ulong uVar5;
  ulong uVar6;
  HighsSplitDeque *pHVar7;
  uint uVar8;
  bool bVar9;
  
  pHVar4 = popSleeper(this,localDeque);
  do {
    if (pHVar4 == (HighsSplitDeque *)0x0) {
      return;
    }
    if ((localDeque->ownerData).allStolenCopy == true) {
      uVar8 = (localDeque->ownerData).splitCopy;
    }
    else {
      LOCK();
      paVar1 = &(localDeque->stealerData).ts;
      uVar5 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i + 0x100000000;
      UNLOCK();
      uVar2 = (localDeque->ownerData).splitCopy;
      uVar8 = (uint)(uVar5 >> 0x20);
      if (uVar2 == uVar8) {
        (localDeque->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
             uVar5 & 0xffffffff00000000 | (ulong)uVar2;
      }
    }
    uVar2 = (localDeque->ownerData).splitCopy;
    if (uVar8 == uVar2) {
      if ((localDeque->ownerData).head == uVar2) {
        (localDeque->ownerData).allStolenCopy = true;
        (localDeque->stealerData).allStolen._M_base._M_i = true;
        LOCK();
        (this->haveJobs).super___atomic_base<int>._M_i =
             (this->haveJobs).super___atomic_base<int>._M_i + -1;
        UNLOCK();
      }
      uVar5 = (this->sleeperStack).super___atomic_base<unsigned_long>._M_i;
      do {
        if ((uVar5 & 0xfffff) == 0) {
          pHVar7 = (HighsSplitDeque *)0x0;
        }
        else {
          pHVar7 = (pHVar4->ownerData).workers[(uVar5 & 0xfffff) - 1]._M_t.
                   super___uniq_ptr_impl<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsSplitDeque_*,_highs::cache_aligned::Deleter<HighsSplitDeque>_>
                   .super__Head_base<0UL,_HighsSplitDeque_*,_false>._M_head_impl;
        }
        (pHVar4->workerBunkData).nextSleeper._M_b._M_p = pHVar7;
        LOCK();
        uVar6 = (this->sleeperStack).super___atomic_base<unsigned_long>._M_i;
        bVar9 = uVar5 == uVar6;
        if (bVar9) {
          (this->sleeperStack).super___atomic_base<unsigned_long>._M_i =
               (long)(pHVar4->workerBunkData).ownerId + 1U | (uVar5 & 0xfffffffffff00000) + 0x100000
          ;
          uVar6 = uVar5;
        }
        UNLOCK();
        uVar5 = uVar6;
      } while (!bVar9);
LAB_002273d6:
      bVar9 = false;
    }
    else {
      (pHVar4->stealerData).injectedTask = (localDeque->taskArray)._M_elems + uVar8;
      HighsBinarySemaphore::release(&(pHVar4->stealerData).semaphore);
      uVar3 = (localDeque->ownerData).splitCopy;
      if (uVar8 == uVar3 - 1) {
        if ((localDeque->ownerData).head == uVar3) {
          (localDeque->ownerData).allStolenCopy = true;
          (localDeque->stealerData).allStolen._M_base._M_i = true;
          LOCK();
          (this->haveJobs).super___atomic_base<int>._M_i =
               (this->haveJobs).super___atomic_base<int>._M_i + -1;
          UNLOCK();
        }
        goto LAB_002273d6;
      }
      pHVar4 = popSleeper(this,localDeque);
      bVar9 = true;
    }
    if (!bVar9) {
      return;
    }
  } while( true );
}

Assistant:

void publishWork(HighsSplitDeque* localDeque) {
      HighsSplitDeque* sleeper = popSleeper(localDeque);
      while (sleeper) {
        uint32_t t = localDeque->selfStealAndGetTail();
        if (t == localDeque->ownerData.splitCopy) {
          if (localDeque->ownerData.head == localDeque->ownerData.splitCopy) {
            localDeque->ownerData.allStolenCopy = true;
            localDeque->stealerData.allStolen.store(true,
                                                    std::memory_order_relaxed);
            haveJobs.fetch_add(-1, std::memory_order_release);
          }
          pushSleeper(sleeper);
          return;
        } else {
          sleeper->injectTaskAndNotify(&localDeque->taskArray[t]);
        }

        if (t == localDeque->ownerData.splitCopy - 1) {
          if (localDeque->ownerData.head == localDeque->ownerData.splitCopy) {
            localDeque->ownerData.allStolenCopy = true;
            localDeque->stealerData.allStolen.store(true,
                                                    std::memory_order_relaxed);
            haveJobs.fetch_add(-1, std::memory_order_release);
          }
          return;
        }

        sleeper = popSleeper(localDeque);
      }
    }